

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O1

void __thiscall EnrichableI2cAnalyzer::~EnrichableI2cAnalyzer(EnrichableI2cAnalyzer *this)

{
  pointer puVar1;
  EnrichableAnalyzerSubprocess *pEVar2;
  EnrichableI2cAnalyzerResults *pEVar3;
  EnrichableI2cAnalyzerSettings *pEVar4;
  
  *(undefined ***)this = &PTR__EnrichableI2cAnalyzer_00110c58;
  Analyzer::KillThread();
  puVar1 = (this->mArrowLocataions).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  EnrichableI2cSimulationDataGenerator::~EnrichableI2cSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  pEVar2 = (this->mSubprocess)._M_ptr;
  if (pEVar2 != (EnrichableAnalyzerSubprocess *)0x0) {
    (*pEVar2->_vptr_EnrichableAnalyzerSubprocess[1])();
  }
  pEVar3 = (this->mResults)._M_ptr;
  if (pEVar3 != (EnrichableI2cAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pEVar3 + 8))();
  }
  pEVar4 = (this->mSettings)._M_ptr;
  if (pEVar4 != (EnrichableI2cAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pEVar4 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

EnrichableI2cAnalyzer::~EnrichableI2cAnalyzer()
{
	KillThread();
}